

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwidgettextcontrol.cpp
# Opt level: O2

void __thiscall QWidgetTextControl::insertFromMimeData(QWidgetTextControl *this,QMimeData *source)

{
  long lVar1;
  long lVar2;
  bool bVar3;
  char cVar4;
  QStringBuilder<QLatin1String,_QString> *this_00;
  QStringBuilder<QLatin1String,_QString> *this_01;
  long in_FS_OFFSET;
  QLatin1StringView latin1;
  QLatin1StringView latin1_00;
  QLatin1StringView latin1_01;
  QArrayDataPointer<char16_t> QStack_f8;
  QArrayDataPointer<char> local_e0;
  QStringBuilder<QLatin1String,_QString> local_c8;
  QArrayDataPointer<char16_t> local_98;
  undefined1 local_78 [36];
  undefined4 uStack_54;
  undefined4 uStack_50;
  undefined4 uStack_4c;
  undefined1 *local_48;
  QTextDocumentFragment fragment;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  if ((source == (QMimeData *)0x0) ||
     (lVar2 = *(long *)(this + 8), (*(uint *)(lVar2 + 0xb0) & 0x10) == 0)) goto LAB_00483097;
  _fragment = &DAT_aaaaaaaaaaaaaaaa;
  QTextDocumentFragment::QTextDocumentFragment(&fragment);
  local_48 = &DAT_aaaaaaaaaaaaaaaa;
  local_78._32_4_ = 0xaaaaaaaa;
  uStack_54 = 0xaaaaaaaa;
  uStack_50 = 0xaaaaaaaa;
  uStack_4c = 0xaaaaaaaa;
  (**(code **)(*(long *)source + 0x68))(local_78 + 0x20,source);
  if (local_48 == (undefined1 *)0x0) {
LAB_00482eab:
    latin1_00.m_data = "application/x-qrichtext";
    latin1_00.m_size = 0x17;
    QString::QString((QString *)&local_c8,latin1_00);
    cVar4 = (**(code **)(*(long *)source + 0x60))(source,&local_c8);
    if (cVar4 != '\0') {
      cVar4 = *(char *)(lVar2 + 0x111);
      QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_c8);
      if (cVar4 != '\x01') goto LAB_00482fb9;
      this_00 = (QStringBuilder<QLatin1String,_QString> *)local_78;
      local_78._16_8_ = &DAT_aaaaaaaaaaaaaaaa;
      local_78._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
      local_78._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
      latin1_01.m_data = "application/x-qrichtext";
      latin1_01.m_size = 0x17;
      QString::QString((QString *)&QStack_f8,latin1_01);
      QMimeData::data((QString *)&local_e0);
      QString::fromUtf8<void>((QString *)&local_98,(QByteArray *)&local_e0);
      local_c8.b.d.size = local_98.size;
      local_c8.b.d.ptr = local_98.ptr;
      local_c8.b.d.d = local_98.d;
      local_c8.a.m_size = 0x25;
      local_c8.a.m_data = "<meta name=\"qrichtext\" content=\"1\" />";
      local_98.d = (Data *)0x0;
      local_98.ptr = (char16_t *)0x0;
      local_98.size = 0;
      QStringBuilder<QLatin1String,_QString>::convertTo<QString>((QString *)this_00,&local_c8);
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_c8.b.d);
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_98);
      QArrayDataPointer<char>::~QArrayDataPointer(&local_e0);
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&QStack_f8);
      this_01 = &local_c8;
LAB_00482feb:
      QTextDocumentFragment::fromHtml((QString *)this_01,(QTextDocument *)this_00);
      goto LAB_0048303d;
    }
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_c8);
LAB_00482fb9:
    cVar4 = QMimeData::hasHtml();
    if ((cVar4 != '\0') && (*(char *)(lVar2 + 0x111) == '\x01')) {
      this_00 = &local_c8;
      QMimeData::html();
      this_01 = (QStringBuilder<QLatin1String,_QString> *)local_78;
      goto LAB_00482feb;
    }
    local_c8.b.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
    local_c8.a.m_size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
    local_c8.a.m_data = &DAT_aaaaaaaaaaaaaaaa;
    QMimeData::text();
    if (local_c8.a.m_data != (char *)0x0) {
      this_01 = (QStringBuilder<QLatin1String,_QString> *)local_78;
      this_00 = &local_c8;
      QTextDocumentFragment::fromPlainText((QString *)this_01);
      goto LAB_0048303d;
    }
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_c8);
  }
  else {
    local_c8.a.m_size = 0xd;
    local_c8.a.m_data = "text/markdown";
    bVar3 = ::operator==((QString *)CONCAT44(uStack_4c,uStack_50),&local_c8.a);
    if (!bVar3) goto LAB_00482eab;
    this_00 = &local_c8;
    local_c8.b.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
    local_c8.a.m_size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
    local_c8.a.m_data = &DAT_aaaaaaaaaaaaaaaa;
    latin1.m_data = "text/markdown";
    latin1.m_size = 0xd;
    QString::QString((QString *)&local_98,latin1);
    QMimeData::data((QString *)local_78);
    QString::fromUtf8<void>((QString *)this_00,(QByteArray *)local_78);
    QArrayDataPointer<char>::~QArrayDataPointer((QArrayDataPointer<char> *)local_78);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_98);
    this_01 = (QStringBuilder<QLatin1String,_QString> *)local_78;
    QTextDocumentFragment::fromMarkdown(this_01,this_00,0x104f0c);
LAB_0048303d:
    QTextDocumentFragment::operator=(&fragment,(QTextDocumentFragment *)this_01);
    QTextDocumentFragment::~QTextDocumentFragment((QTextDocumentFragment *)this_01);
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)this_00);
    QTextCursor::insertFragment((QTextDocumentFragment *)(lVar2 + 0x88));
  }
  (**(code **)(*(long *)this + 0x60))(this);
  QArrayDataPointer<QString>::~QArrayDataPointer((QArrayDataPointer<QString> *)(local_78 + 0x20));
  QTextDocumentFragment::~QTextDocumentFragment(&fragment);
LAB_00483097:
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QWidgetTextControl::insertFromMimeData(const QMimeData *source)
{
    Q_D(QWidgetTextControl);
    if (!(d->interactionFlags & Qt::TextEditable) || !source)
        return;

    bool hasData = false;
    QTextDocumentFragment fragment;
#if QT_CONFIG(textmarkdownreader)
    const auto formats = source->formats();
    if (formats.size() && formats.first() == "text/markdown"_L1) {
        auto s = QString::fromUtf8(source->data("text/markdown"_L1));
        fragment = QTextDocumentFragment::fromMarkdown(s);
        hasData = true;
    } else
#endif
#ifndef QT_NO_TEXTHTMLPARSER
    if (source->hasFormat("application/x-qrichtext"_L1) && d->acceptRichText) {
        // x-qrichtext is always UTF-8 (taken from Qt3 since we don't use it anymore).
        const QString richtext = "<meta name=\"qrichtext\" content=\"1\" />"_L1
                + QString::fromUtf8(source->data("application/x-qrichtext"_L1));
        fragment = QTextDocumentFragment::fromHtml(richtext, d->doc);
        hasData = true;
    } else if (source->hasHtml() && d->acceptRichText) {
        fragment = QTextDocumentFragment::fromHtml(source->html(), d->doc);
        hasData = true;
    }
#endif // QT_NO_TEXTHTMLPARSER
    if (!hasData) {
        const QString text = source->text();
        if (!text.isNull()) {
            fragment = QTextDocumentFragment::fromPlainText(text);
            hasData = true;
        }
    }

    if (hasData)
        d->cursor.insertFragment(fragment);
    ensureCursorVisible();
}